

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O3

CURLcode tool_setopt_bitmask(CURL *curl,GlobalConfig *config,char *name,CURLoption tag,
                            NameValueUnsigned *nvlist,long lval)

{
  CURLcode CVar1;
  size_t sVar2;
  char *pcVar3;
  unsigned_long rest;
  char *pcVar4;
  NameValueUnsigned *pNVar5;
  char preamble [80];
  char acStack_88 [88];
  
  CVar1 = curl_easy_setopt(curl,tag,lval);
  if ((CVar1 != CURLE_OK || lval == 0) || config->libcurl == (char *)0x0) {
    return CVar1;
  }
  curl_msnprintf(acStack_88,0x50,"curl_easy_setopt(hnd, %s, ",name);
  pcVar3 = nvlist->name;
  if (pcVar3 != (char *)0x0) {
    pNVar5 = nvlist + 1;
    do {
      if ((pNVar5[-1].value & ~lval) == 0) {
        pcVar4 = ");";
        lval = lval & ~pNVar5[-1].value;
        if (lval != 0) {
          pcVar4 = " |";
        }
        CVar1 = easysrc_addf(&easysrc_code,"%s(long)%s%s",acStack_88,pcVar3,pcVar4);
        if (CVar1 != CURLE_OK) {
          return CVar1;
        }
        if (lval == 0) {
          return CURLE_OK;
        }
        sVar2 = strlen(acStack_88);
        curl_msnprintf(acStack_88,0x50,"%*s",sVar2,"");
      }
      pcVar3 = pNVar5->name;
      pNVar5 = pNVar5 + 1;
    } while (pcVar3 != (char *)0x0);
    if (lval == 0) {
      return CURLE_OK;
    }
  }
  CVar1 = easysrc_addf(&easysrc_code,"%s%luUL);",acStack_88,lval);
  if (CVar1 == CURLE_OK) {
    return CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode tool_setopt_bitmask(CURL *curl, struct GlobalConfig *config,
                             const char *name, CURLoption tag,
                             const struct NameValueUnsigned *nvlist,
                             long lval)
{
  CURLcode ret = CURLE_OK;
  bool skip = FALSE;

  ret = curl_easy_setopt(curl, tag, lval);
  if(!lval)
    skip = TRUE;

  if(config->libcurl && !skip && !ret) {
    /* we only use this for real if --libcurl was used */
    char preamble[80];
    unsigned long rest = (unsigned long)lval;
    const struct NameValueUnsigned *nv = NULL;
    msnprintf(preamble, sizeof(preamble),
              "curl_easy_setopt(hnd, %s, ", name);
    for(nv = nvlist; nv->name; nv++) {
      if((nv->value & ~ rest) == 0) {
        /* all value flags contained in rest */
        rest &= ~ nv->value;    /* remove bits handled here */
        CODE3("%s(long)%s%s",
              preamble, nv->name, rest ? " |" : ");");
        if(!rest)
          break;                /* handled them all */
        /* replace with all spaces for continuation line */
        msnprintf(preamble, sizeof(preamble), "%*s", strlen(preamble), "");
      }
    }
    /* If any bits have no definition, output an explicit value.
     * This could happen if new bits are defined and used
     * but the NameValue list is not updated. */
    if(rest)
      CODE2("%s%luUL);", preamble, rest);
  }

 nomem:
  return ret;
}